

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O3

void __thiscall Permutazione::differenza(Permutazione *this,Permutazione *p)

{
  ushort uVar1;
  void *__dest;
  unsigned_short *puVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_short *puVar5;
  
  uVar1 = this->dimensione;
  uVar4 = (ulong)uVar1;
  uVar3 = (ulong)((uint)uVar1 * 2);
  __dest = operator_new__(uVar3);
  puVar2 = (unsigned_short *)operator_new__(uVar3);
  puVar5 = p->individuo;
  memcpy(__dest,puVar5,uVar3);
  if (uVar1 == 0) {
LAB_00104953:
    puVar5 = this->individuo;
    if (puVar5 == (unsigned_short *)0x0) goto LAB_00104961;
  }
  else {
    uVar3 = 0;
    do {
      *(short *)((long)__dest + (ulong)puVar5[uVar3] * 2) = (short)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    if (uVar4 == 0) goto LAB_00104953;
    puVar5 = this->individuo;
    uVar3 = 0;
    do {
      puVar2[uVar3] = *(unsigned_short *)((long)__dest + (ulong)puVar5[uVar3] * 2);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  operator_delete__(puVar5);
LAB_00104961:
  operator_delete__(__dest);
  this->individuo = puVar2;
  return;
}

Assistant:

void Permutazione::differenza(Permutazione* p) {

	unsigned short* pCopia = new unsigned short[dimensione];
	unsigned short* thisCopia = new unsigned short[dimensione];
	
	//copiamo l'individuo p
	memcpy(pCopia, p->individuo, sizeof(unsigned short) * dimensione);

	//p^-1 
	for (unsigned short k = 0; k < dimensione; k++) {
		pCopia[p->individuo[k]] = k;
	}

	//p^-1 + this
	for (unsigned short k = 0; k < dimensione; k++) {
		thisCopia[k] = pCopia[this->individuo[k]];
	}

	//assegnamolo a this
	delete[] this->individuo;
	delete[] pCopia;
	this->individuo = thisCopia;
}